

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

parasail_result_t * parasail_result_new(void)

{
  size_t _size;
  parasail_result_t *result;
  
  result = (parasail_result_t *)malloc(0x18);
  if (result == (parasail_result_t *)0x0) {
    fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new",0x18);
    result = (parasail_result_t *)0x0;
  }
  else {
    result->score = 0;
    result->end_query = 0;
    result->end_ref = 0;
    result->flag = 0;
    (result->field_4).extra = (void *)0x0;
  }
  return result;
}

Assistant:

parasail_result_t* parasail_result_new()
{
    /* declare all variables */
    parasail_result_t *result = NULL;

    PARASAIL_NEW(result, parasail_result_t);

    result->score = 0;
    result->end_query = 0;
    result->end_ref = 0;
    result->flag = 0;
    result->extra = NULL;

    return result;
}